

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSweep.c
# Opt level: O1

int Cec_ManFraClassesUpdate_rec(Gia_Obj_t *pObj)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = *(ulong *)pObj;
  uVar3 = 1;
  if ((((uint)uVar1 >> 0x1e & 1) == 0) &&
     (uVar3 = 0, (~uVar1 & 0x9fffffff) != 0 && (~uVar1 & 0x1fffffff1fffffff) != 0)) {
    uVar2 = Cec_ManFraClassesUpdate_rec(pObj + -(uVar1 & 0x1fffffff));
    uVar3 = Cec_ManFraClassesUpdate_rec(pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
    uVar3 = uVar3 | uVar2;
    *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff | (ulong)(uVar3 << 0x1e);
  }
  return uVar3;
}

Assistant:

int Cec_ManFraClassesUpdate_rec( Gia_Obj_t * pObj )
{
    int Result;
    if ( pObj->fMark0 )
        return 1;
    if ( Gia_ObjIsCi(pObj) || Gia_ObjIsConst0(pObj) )
        return 0;
    Result = (Cec_ManFraClassesUpdate_rec( Gia_ObjFanin0(pObj) ) |
              Cec_ManFraClassesUpdate_rec( Gia_ObjFanin1(pObj) ));
    return pObj->fMark0 = Result;
}